

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  time_t tVar7;
  GLFWmonitor **ppGVar8;
  GLFWvidmode *pGVar9;
  GLFWwindow *handle;
  char *pcVar10;
  undefined1 *puVar11;
  float *pfVar12;
  int i;
  long lVar13;
  int j;
  long lVar14;
  byte bVar15;
  long lVar16;
  int height_00;
  GLFWmonitor *handle_00;
  undefined4 uVar17;
  float fVar18;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  int height;
  int width;
  GLuint vertex_buffer;
  mat4x4 mvp;
  int monitorCount;
  mat4x4 p;
  mat4x4 m;
  int local_154;
  int local_150;
  GLuint local_14c;
  undefined1 local_148 [16];
  float local_138;
  undefined4 uStack_134;
  undefined8 uStack_130;
  ulong local_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 local_fc;
  float local_f8 [2];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  undefined8 local_b4;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_84;
  undefined4 local_7c;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x22002,2);
    glfwWindowHint(0x22003,0);
    bVar15 = 0;
    while( true ) {
      if ((bool)(bVar15 & 1)) {
        ppGVar8 = glfwGetMonitors((int *)local_f8);
        iVar2 = rand();
        handle_00 = ppGVar8[iVar2 % (int)local_f8[0]];
      }
      else {
        handle_00 = (GLFWmonitor *)0x0;
      }
      if (handle_00 == (GLFWmonitor *)0x0) {
        iVar2 = 0x280;
        height_00 = 0x1e0;
      }
      else {
        pGVar9 = glfwGetVideoMode(handle_00);
        iVar2 = pGVar9->width;
        height_00 = pGVar9->height;
      }
      dVar1 = glfwGetTime();
      local_148._0_8_ = dVar1;
      handle = glfwCreateWindow(iVar2,height_00,"Window Re-opener",handle_00,(GLFWwindow *)0x0);
      if (handle == (GLFWwindow *)0x0) break;
      if (handle_00 == (GLFWmonitor *)0x0) {
        dVar1 = glfwGetTime();
        printf("Opening regular window took %0.3f seconds\n",
               SUB84(dVar1 - (double)local_148._0_8_,0));
      }
      else {
        pcVar10 = glfwGetMonitorName(handle_00);
        dVar1 = glfwGetTime();
        printf("Opening full screen window on monitor %s took %0.3f seconds\n",
               SUB84(dVar1 - (double)local_148._0_8_,0),pcVar10);
      }
      glfwSetWindowCloseCallback(handle,window_close_callback);
      glfwSetKeyCallback(handle,key_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      GVar3 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar3,1,&vertex_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar3);
      GVar4 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar4,1,&fragment_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar4);
      GVar5 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar5,GVar3);
      (*glad_glAttachShader)(GVar5,GVar4);
      (*glad_glLinkProgram)(GVar5);
      GVar6 = (*glad_glGetUniformLocation)(GVar5,"MVP");
      GVar3 = (*glad_glGetAttribLocation)(GVar5,"vPos");
      (*glad_glGenBuffers)(1,&local_14c);
      (*glad_glBindBuffer)(0x8892,local_14c);
      (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
      (*glad_glEnableVertexAttribArray)(GVar3);
      (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',8,(void *)0x0);
      glfwSetTime(0.0);
      dVar1 = glfwGetTime();
      while (dVar1 < 5.0) {
        glfwGetFramebufferSize(handle,&local_150,&local_154);
        local_148 = ZEXT416((uint)((float)local_150 / (float)local_154));
        (*glad_glViewport)(0,0,local_150,local_154);
        (*glad_glClear)(0x4000);
        local_b8 = 2.0 / ((float)local_148._0_4_ + (float)local_148._0_4_);
        local_ac = 0;
        local_b4 = 0;
        local_a8 = 0x3f80000000000000;
        uStack_a0 = 0;
        local_90 = 0xc0000000;
        local_98 = 0;
        local_88 = -((float)local_148._0_4_ - (float)local_148._0_4_) /
                   ((float)local_148._0_4_ + (float)local_148._0_4_);
        local_84 = 0xbf80000080000000;
        local_7c = 0x3f800000;
        lVar13 = 0;
        puVar11 = local_78;
        do {
          lVar14 = 0;
          do {
            uVar17 = 0x3f800000;
            if (lVar13 != lVar14) {
              uVar17 = 0;
            }
            *(undefined4 *)(puVar11 + lVar14 * 4) = uVar17;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          lVar13 = lVar13 + 1;
          puVar11 = puVar11 + 0x10;
        } while (lVar13 != 4);
        dVar1 = glfwGetTime();
        local_148._0_4_ = sinf((float)dVar1);
        local_148._4_4_ = extraout_XMM0_Db;
        local_148._8_4_ = extraout_XMM0_Dc;
        local_148._12_4_ = extraout_XMM0_Dd;
        fVar18 = cosf((float)dVar1);
        _local_138 = CONCAT44(local_148._0_4_,fVar18);
        uStack_130 = 0;
        local_128 = CONCAT44(fVar18,local_148._0_4_) ^ 0x80000000;
        uStack_120 = 0;
        uStack_118 = 0;
        local_110 = 0x3f800000;
        local_10c = 0;
        uStack_108 = 0;
        uStack_104 = 0;
        uStack_100 = 0;
        local_fc = 0x3f800000;
        pfVar12 = &local_138;
        lVar13 = 0;
        do {
          lVar14 = 0;
          puVar11 = local_78;
          do {
            local_f8[lVar13 * 4 + lVar14] = 0.0;
            fVar18 = 0.0;
            lVar16 = 0;
            do {
              fVar18 = fVar18 + *(float *)(puVar11 + lVar16 * 4) *
                                *(float *)((long)pfVar12 + lVar16);
              lVar16 = lVar16 + 4;
            } while (lVar16 != 0x10);
            local_f8[lVar13 * 4 + lVar14] = fVar18;
            lVar14 = lVar14 + 1;
            puVar11 = puVar11 + 4;
          } while (lVar14 != 4);
          lVar13 = lVar13 + 1;
          pfVar12 = pfVar12 + 4;
        } while (lVar13 != 4);
        local_48 = local_c8;
        uStack_40 = uStack_c0;
        local_58 = local_d8;
        uStack_50 = uStack_d0;
        local_68 = local_e8;
        uStack_60 = uStack_e0;
        uStack_70 = uStack_f0;
        lVar13 = 0;
        puVar11 = local_78;
        do {
          lVar14 = 0;
          pfVar12 = &local_b8;
          do {
            local_f8[lVar13 * 4 + lVar14] = 0.0;
            fVar18 = 0.0;
            lVar16 = 0;
            do {
              fVar18 = fVar18 + pfVar12[lVar16] * *(float *)(puVar11 + lVar16);
              lVar16 = lVar16 + 4;
            } while (lVar16 != 0x10);
            local_f8[lVar13 * 4 + lVar14] = fVar18;
            lVar14 = lVar14 + 1;
            pfVar12 = pfVar12 + 1;
          } while (lVar14 != 4);
          lVar13 = lVar13 + 1;
          puVar11 = puVar11 + 0x10;
        } while (lVar13 != 4);
        uStack_108 = (undefined4)local_c8;
        uStack_104 = (undefined4)((ulong)local_c8 >> 0x20);
        uStack_100 = (undefined4)uStack_c0;
        local_fc = (undefined4)((ulong)uStack_c0 >> 0x20);
        uStack_118 = local_d8;
        local_110 = (undefined4)uStack_d0;
        local_10c = (undefined4)((ulong)uStack_d0 >> 0x20);
        local_128 = local_e8;
        uStack_120 = uStack_e0;
        uStack_130 = uStack_f0;
        (*glad_glUseProgram)(GVar5);
        (*glad_glUniformMatrix4fv)(GVar6,1,'\0',&local_138);
        (*glad_glDrawArrays)(6,0,4);
        glfwSwapBuffers(handle);
        glfwPollEvents();
        iVar2 = glfwWindowShouldClose(handle);
        if (iVar2 != 0) {
          close_window(handle);
          puts("User closed window");
          glfwTerminate();
          exit(0);
        }
        dVar1 = glfwGetTime();
      }
      puts("Closing window");
      close_window(handle);
      bVar15 = bVar15 + 1;
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    double base;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    for (;;)
    {
        int width, height;
        GLFWmonitor* monitor = NULL;
        GLuint vertex_shader, fragment_shader, program, vertex_buffer;
        GLint mvp_location, vpos_location;

        if (count & 1)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        if (monitor)
        {
            const GLFWvidmode* mode = glfwGetVideoMode(monitor);
            width = mode->width;
            height = mode->height;
        }
        else
        {
            width = 640;
            height = 480;
        }

        base = glfwGetTime();

        window = glfwCreateWindow(width, height, "Window Re-opener", monitor, NULL);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        if (monitor)
        {
            printf("Opening full screen window on monitor %s took %0.3f seconds\n",
                   glfwGetMonitorName(monitor),
                   glfwGetTime() - base);
        }
        else
        {
            printf("Opening regular window took %0.3f seconds\n",
                   glfwGetTime() - base);
        }

        glfwSetWindowCloseCallback(window, window_close_callback);
        glfwSetKeyCallback(window, key_callback);

        glfwMakeContextCurrent(window);
        gladLoadGL(glfwGetProcAddress);
        glfwSwapInterval(1);

        vertex_shader = glCreateShader(GL_VERTEX_SHADER);
        glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
        glCompileShader(vertex_shader);

        fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
        glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
        glCompileShader(fragment_shader);

        program = glCreateProgram();
        glAttachShader(program, vertex_shader);
        glAttachShader(program, fragment_shader);
        glLinkProgram(program);

        mvp_location = glGetUniformLocation(program, "MVP");
        vpos_location = glGetAttribLocation(program, "vPos");

        glGenBuffers(1, &vertex_buffer);
        glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
        glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

        glEnableVertexAttribArray(vpos_location);
        glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                              sizeof(vertices[0]), (void*) 0);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            float ratio;
            int width, height;
            mat4x4 m, p, mvp;

            glfwGetFramebufferSize(window, &width, &height);
            ratio = width / (float) height;

            glViewport(0, 0, width, height);
            glClear(GL_COLOR_BUFFER_BIT);

            mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 0.f, 1.f);

            mat4x4_identity(m);
            mat4x4_rotate_Z(m, m, (float) glfwGetTime());
            mat4x4_mul(mvp, p, m);

            glUseProgram(program);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
            glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}